

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

void xmlXPathCeilingFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  int code;
  xmlXPathObjectPtr pxVar1;
  double dVar2;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs == 1) {
    if (ctxt->valueNr < 1) {
      code = 0x17;
    }
    else {
      pxVar1 = ctxt->value;
      if (pxVar1 != (xmlXPathObjectPtr)0x0) {
        if (pxVar1->type == XPATH_NUMBER) {
LAB_001c06e8:
          dVar2 = ceil(pxVar1->floatval);
          pxVar1->floatval = dVar2;
          return;
        }
        xmlXPathNumberFunction(ctxt,1);
        pxVar1 = ctxt->value;
        if ((pxVar1 != (xmlXPathObjectPtr)0x0) && (pxVar1->type == XPATH_NUMBER)) goto LAB_001c06e8;
      }
      code = 0xb;
    }
  }
  else {
    code = 0xc;
  }
  xmlXPathErr(ctxt,code);
  return;
}

Assistant:

void
xmlXPathCeilingFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    CHECK_ARITY(1);
    CAST_TO_NUMBER;
    CHECK_TYPE(XPATH_NUMBER);

#ifdef _AIX
    /* Work around buggy ceil() function on AIX */
    ctxt->value->floatval = copysign(ceil(ctxt->value->floatval), ctxt->value->floatval);
#else
    ctxt->value->floatval = ceil(ctxt->value->floatval);
#endif
}